

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMNodeIteratorImpl::removeNode(DOMNodeIteratorImpl *this,DOMNode *node)

{
  int iVar1;
  undefined4 extraout_var;
  DOMNode *pDVar2;
  DOMNode *pDVar3;
  DOMException *this_00;
  
  if (this->fDetached == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      pDVar3 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar3 = &this->fDocument[10].super_DOMNode;
    }
    DOMException::DOMException(this_00,0xb,0,(MemoryManager *)pDVar3->_vptr_DOMNode);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if ((node != (DOMNode *)0x0) && (pDVar3 = this->fCurrentNode, pDVar3 != this->fRoot)) {
    do {
      if (pDVar3 == node) {
        if (this->fForward == true) {
          pDVar2 = previousNode(this,pDVar3);
        }
        else {
          pDVar2 = nextNode(this,pDVar3,false);
          if (pDVar2 == (DOMNode *)0x0) {
            pDVar3 = previousNode(this,pDVar3);
            this->fCurrentNode = pDVar3;
            this->fForward = true;
            return;
          }
        }
        this->fCurrentNode = pDVar2;
        return;
      }
      iVar1 = (*pDVar3->_vptr_DOMNode[5])(pDVar3);
      pDVar3 = (DOMNode *)CONCAT44(extraout_var,iVar1);
    } while (pDVar3 != this->fRoot);
  }
  return;
}

Assistant:

void DOMNodeIteratorImpl::removeNode (DOMNode* node) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    // Implementation note: Fix-up means setting the current node properly
    // after a remove.

    if (!node) return;

    DOMNode* deleted = matchNodeOrParent(node);

    if (!deleted) return;

    if (fForward) {
        fCurrentNode = previousNode(deleted);
    } else
    // if (!fForward)
    {
        DOMNode* next = nextNode(deleted, false);
        if (next != 0) {
            // normal case: there _are_ nodes following this in the iterator.
            fCurrentNode = next;
        } else {
            // the last node in the iterator is to be removed,
            // so we set the current node to be the previous one.
            fCurrentNode = previousNode(deleted);
            fForward = true;
        }

    }

}